

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

time_t Time::timeGM(tm *tm)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  time_t tVar4;
  long lVar5;
  uint uVar6;
  
  uVar1 = tm->tm_mon;
  if ((ulong)uVar1 < 0xc) {
    iVar2 = tm->tm_year;
    if (0x45 < (long)iVar2) {
      uVar6 = (iVar2 - (uint)((int)uVar1 < 2)) + 0x76c;
      iVar3 = (uint)timeGM::moff[uVar1] + tm->tm_mday + -1;
      tm->tm_yday = iVar3;
      lVar5 = (long)tm->tm_sec + -0x83941500 +
              ((long)tm->tm_min +
              ((long)tm->tm_hour +
              ((long)iVar3 + (long)iVar2 * 0x16d +
              (long)(int)(uVar6 / 400 + ((uVar6 >> 2) - uVar6 / 100) + -0x1dd)) * 0x18) * 0x3c) *
              0x3c;
      tVar4 = -1;
      if (-1 < lVar5) {
        tVar4 = lVar5;
      }
      return tVar4;
    }
  }
  return -1;
}

Assistant:

static time_t timeGM(struct tm * tm)
    {
        // Common cummulative year days before the given month
        static const unsigned short moff[12] = { 0, 31, 59, 90, 120, 151, 181, 212, 243, 273, 304, 334 };

        if ((unsigned)tm->tm_mon >= 12) return (time_t)-1;
        
        if (tm->tm_year < 70)
            return (time_t) -1;

        int y = tm->tm_year + 1900 - (tm->tm_mon < 2);
        
        int nleapdays = y / 4 - y / 100 + y / 400 - (1969 / 4 - 1969 / 100 + 1969 / 400);
        tm->tm_yday = moff[tm->tm_mon] + tm->tm_mday - 1; // Fix up tm_yday
        
        time_t t = ((((time_t) (tm->tm_year - 70) * 365 + tm->tm_yday + nleapdays) * 24 +
            tm->tm_hour) * 60 + tm->tm_min) * 60 + tm->tm_sec;

        return (t < 0 ? (time_t)-1 : t);
    }